

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

int Abc_NtkCecSat_saucy(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int *pModel)

{
  int iVar1;
  Abc_Ntk_t *pMiter_00;
  int *piVar2;
  Abc_Ntk_t *pNtk;
  int local_48;
  int i;
  int nInsLimit;
  int nConfLimit;
  int RetValue;
  Abc_Ntk_t *pCnf;
  Abc_Ntk_t *pMiter;
  int *pModel_local;
  Abc_Ntk_t *pNtk2_local;
  Abc_Ntk_t *pNtk1_local;
  
  pMiter_00 = Abc_NtkMiter(pNtk1,pNtk2,1,0,0,0);
  if (pMiter_00 == (Abc_Ntk_t *)0x0) {
    printf("Miter computation has failed.\n");
    exit(1);
  }
  iVar1 = Abc_NtkMiterIsConstant(pMiter_00);
  if (iVar1 == 0) {
    piVar2 = Abc_NtkVerifyGetCleanModel(pMiter_00,1);
    pMiter_00->pModel = piVar2;
    for (local_48 = 0; iVar1 = Abc_NtkPiNum(pNtk1), local_48 < iVar1; local_48 = local_48 + 1) {
      pModel[local_48] = pMiter_00->pModel[local_48];
    }
    if (pMiter_00->pModel != (int *)0x0) {
      free(pMiter_00->pModel);
      pMiter_00->pModel = (int *)0x0;
    }
    Abc_NtkDelete(pMiter_00);
    pNtk1_local._4_4_ = 0;
  }
  else if (iVar1 == 1) {
    Abc_NtkDelete(pMiter_00);
    pNtk1_local._4_4_ = 1;
  }
  else {
    pNtk = Abc_NtkMulti(pMiter_00,0,100,1,0,0,0);
    Abc_NtkDelete(pMiter_00);
    if (pNtk == (Abc_Ntk_t *)0x0) {
      printf("Renoding for CNF has failed.\n");
      exit(1);
    }
    pNtk1_local._4_4_ = Abc_NtkMiterSat(pNtk,10000,0,0,(ABC_INT64_T *)0x0,(ABC_INT64_T *)0x0);
    if (pNtk1_local._4_4_ == -1) {
      printf("Networks are undecided (SAT solver timed out).\n");
      exit(1);
    }
    if (pNtk->pModel != (int *)0x0) {
      for (local_48 = 0; iVar1 = Abc_NtkPiNum(pNtk1), local_48 < iVar1; local_48 = local_48 + 1) {
        pModel[local_48] = pNtk->pModel[local_48];
      }
    }
    if (pNtk->pModel != (int *)0x0) {
      free(pNtk->pModel);
      pNtk->pModel = (int *)0x0;
    }
    Abc_NtkDelete(pNtk);
  }
  return pNtk1_local._4_4_;
}

Assistant:

static int
Abc_NtkCecSat_saucy( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int * pModel )
{
    extern Abc_Ntk_t * Abc_NtkMulti( Abc_Ntk_t * pNtk, int nThresh, int nFaninMax, int fCnf, int fMulti, int fSimple, int fFactor );
    Abc_Ntk_t * pMiter;
    Abc_Ntk_t * pCnf;
    int RetValue;
    int nConfLimit;
    int nInsLimit;
    int i;

    nConfLimit = 10000;
    nInsLimit = 0;  

    /* get the miter of the two networks */
    pMiter = Abc_NtkMiter( pNtk1, pNtk2, 1, 0, 0, 0 );
    if ( pMiter == NULL )
    {
        printf( "Miter computation has failed.\n" );
        exit(1);
    }
    RetValue = Abc_NtkMiterIsConstant( pMiter );
    if ( RetValue == 0 )
    {
        //printf( "Networks are NOT EQUIVALENT after structural hashing.\n" );
        /* report the error */
        pMiter->pModel = Abc_NtkVerifyGetCleanModel( pMiter, 1 );       
        for (i = 0; i < Abc_NtkPiNum(pNtk1); i++)
            pModel[i] = pMiter->pModel[i];  
        ABC_FREE( pMiter->pModel );
        Abc_NtkDelete( pMiter );
        return 0;
    }
    if ( RetValue == 1 )
    {
        Abc_NtkDelete( pMiter );
        //printf( "Networks are equivalent after structural hashing.\n" );
        return 1;
    }

    /* convert the miter into a CNF */
    pCnf = Abc_NtkMulti( pMiter, 0, 100, 1, 0, 0, 0 );
    Abc_NtkDelete( pMiter );
    if ( pCnf == NULL )
    {
        printf( "Renoding for CNF has failed.\n" );
        exit(1);
    }

    /* solve the CNF using the SAT solver */
    RetValue = Abc_NtkMiterSat( pCnf, (ABC_INT64_T)nConfLimit, (ABC_INT64_T)nInsLimit, 0, NULL, NULL );
    if ( RetValue == -1 ) {
        printf( "Networks are undecided (SAT solver timed out).\n" );
        exit(1);
    }
    /*else if ( RetValue == 0 )
        printf( "Networks are NOT EQUIVALENT after SAT.\n" );
    else
        printf( "Networks are equivalent after SAT.\n" );*/
    if ( pCnf->pModel ) {       
        for (i = 0; i < Abc_NtkPiNum(pNtk1); i++)
            pModel[i] = pCnf->pModel[i];
    }
    ABC_FREE( pCnf->pModel );
    Abc_NtkDelete( pCnf );

    return RetValue;
}